

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O3

double testExtendedKalmanFilterLTV(void)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  Index col;
  long lVar12;
  Index i_1;
  long lVar13;
  long lVar14;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *y_k;
  uint k_00;
  ActualDstType actualDst;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar15;
  iterator iVar16;
  iterator iVar17;
  uint i;
  uint k;
  InputVector *u_k;
  byte bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  StateVector xh;
  StateVector x;
  KalmanFunctorLTV func;
  unit_normal_distribution<double> impl;
  Qmatrix q1;
  Amatrix a;
  Rmatrix r;
  Qmatrix q;
  StateVector dx;
  InputVector uk [1001];
  lagged_fibonacci1279 gen_;
  MeasureVector yk [1000];
  double dStack_12ad8;
  double adStack_12ab8 [1];
  double dStack_12aa8;
  double dStack_12aa0;
  StateVector SStack_12a88;
  double dStack_12a60;
  double dStack_12a58;
  double dStack_12a50;
  StateVector SStack_12a48;
  double adStack_12a28 [6];
  double adStack_129f8 [4];
  DynamicsFunctorBase DStack_129d8;
  void *pvStack_129d0;
  iterator iStack_129c8;
  Matrix<double,_4,_4,_0,_4,_4> *pMStack_129c0;
  void *pvStack_129b8;
  iterator iStack_129b0;
  Matrix<double,_3,_4,_0,_3,_4> *pMStack_129a8;
  double dStack_12998;
  double dStack_12990;
  double dStack_12988;
  double dStack_12980;
  double dStack_12978;
  double dStack_12970;
  double dStack_12968;
  double dStack_12958;
  double dStack_12950;
  double dStack_12948;
  double dStack_12940;
  double dStack_12938;
  double dStack_12930;
  double dStack_12928;
  double dStack_12920;
  double dStack_12918;
  double dStack_12910;
  double dStack_12908;
  double dStack_12900;
  double dStack_128f8;
  double dStack_128f0;
  double dStack_128e8;
  double dStack_128e0;
  double dStack_128d8;
  double dStack_128d0;
  double dStack_128c8;
  double dStack_128c0;
  double dStack_128b8;
  double dStack_128b0;
  double dStack_128a8;
  double dStack_128a0;
  double dStack_12898;
  double dStack_12890;
  double dStack_12888;
  undefined1 auStack_12878 [16];
  Cmatrix CStack_12868;
  double adStack_12808 [16];
  Amatrix AStack_12788;
  StateVector SStack_12708;
  double dStack_126e8;
  double dStack_126e0;
  double dStack_126d8;
  double dStack_126d0;
  double dStack_126c8;
  double dStack_126c0;
  double dStack_126b8;
  double dStack_126b0;
  double dStack_126a8;
  double adStack_12698 [16];
  StateVector SStack_12618;
  ExtendedKalmanFilter<4U,_3U,_1U> EStack_125f8;
  DenseStorage<double,_1,_1,_1,_0> DStack_12268;
  InputVector aIStack_12260 [1001];
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> lStack_10318;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_db18 [750];
  undefined1 local_7d58 [24];
  double adStack_7d40 [4002];
  
  bVar18 = 0;
  stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::ExtendedKalmanFilter
            (&EStack_125f8,true);
  DStack_129d8._vptr_DynamicsFunctorBase =
       (_func_int **)&PTR_Matrix<double,1,1,0,1,1>_const__unsigned_int__00121650;
  pvStack_129d0 = (void *)0x0;
  iStack_129c8._M_current = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  pMStack_129c0 = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  pvStack_129b8 = (void *)0x0;
  iStack_129b0._M_current = (Matrix<double,_3,_4,_0,_3,_4> *)0x0;
  pMStack_129a8 = (Matrix<double,_3,_4,_0,_3,_4> *)0x0;
  iVar8 = rand();
  dStack_12998 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  dStack_12990 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  dStack_12988 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  dStack_12980 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  dStack_12978 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  dStack_12970 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  dStack_12968 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = 0;
  do {
    lVar13 = 0;
    do {
      iVar9 = rand();
      *(double *)(local_7d58 + lVar13 * 8) =
           (((double)iVar9 + (double)iVar9) / 2147483647.0 + -1.0) * 0.5;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    if (iStack_129c8._M_current == pMStack_129c0) {
      std::
      vector<Eigen::Matrix<double,4,4,0,4,4>,Eigen::aligned_allocator<Eigen::Matrix<double,4,4,0,4,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>>
                ((vector<Eigen::Matrix<double,4,4,0,4,4>,Eigen::aligned_allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                  *)&pvStack_129d0,iStack_129c8,(Matrix<double,_4,_4,_0,_4,_4> *)local_7d58);
    }
    else {
      pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)local_7d58;
      iVar16._M_current = iStack_129c8._M_current;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        ((iVar16._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
        m_storage.m_data.array[0] =
             (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
             m_data.array[0];
        pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
        iVar16._M_current =
             (Matrix<double,_4,_4,_0,_4,_4> *)
             ((long)iVar16._M_current + ((ulong)bVar18 * -2 + 1) * 8);
      }
      iStack_129c8._M_current = iStack_129c8._M_current + 1;
    }
    lStack_10318._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_7d58;
    local_db18[0].m_dst = (DstEvaluatorType *)&lStack_10318;
    local_db18[0].m_src = (SrcEvaluatorType *)&DStack_12268;
    local_db18[0].m_functor = (assign_op<double,_double> *)adStack_12808;
    local_db18[0].m_dstExpr = (DstXprType *)local_7d58;
    iVar9 = rand();
    uVar7 = lStack_10318._0_8_;
    local_7d58._0_8_ = ((double)iVar9 + (double)iVar9) / 2147483647.0 + -1.0;
    iVar9 = rand();
    (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)uVar7)->m_storage).m_data.array[1] =
         ((double)iVar9 + (double)iVar9) / 2147483647.0 + -1.0;
    uVar7 = lStack_10318._0_8_;
    iVar9 = rand();
    (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)uVar7)->m_storage).m_data.array[2] =
         ((double)iVar9 + (double)iVar9) / 2147483647.0 + -1.0;
    Eigen::internal::
    copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_12>
    ::run(local_db18);
    if (iStack_129b0._M_current == pMStack_129a8) {
      std::
      vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>>
                ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                  *)&pvStack_129b8,iStack_129b0,(Matrix<double,_3,_4,_0,_3,_4> *)local_7d58);
    }
    else {
      pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)local_7d58;
      iVar17._M_current = iStack_129b0._M_current;
      for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
        ((iVar17._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0] =
             (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
             m_data.array[0];
        pMVar15 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
        iVar17._M_current =
             (Matrix<double,_3,_4,_0,_3,_4> *)
             ((long)iVar17._M_current + ((ulong)bVar18 * -2 + 1) * 8);
      }
      iStack_129b0._M_current = iStack_129b0._M_current + 1;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x3e9);
  EStack_125f8.f_ = &DStack_129d8;
  SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
            (&lStack_10318,
             &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
  iVar8 = rand();
  iVar9 = rand();
  auVar23._0_8_ = (double)iVar8 + (double)iVar8;
  auVar23._8_8_ = (double)iVar9 + (double)iVar9;
  auVar23 = divpd(auVar23,_DAT_00119010);
  adStack_12a28[0] = (auVar23._0_8_ + -1.0) * 0.01;
  adStack_12a28[1] = (auVar23._8_8_ + -1.0) * 0.01;
  iVar8 = rand();
  iVar9 = rand();
  iVar10 = rand();
  auVar24._0_8_ = (double)iVar9 + (double)iVar9;
  auVar24._8_8_ = (double)iVar10 + (double)iVar10;
  auVar23 = divpd(auVar24,_DAT_00119010);
  adStack_12a28[3] = (auVar23._0_8_ + -1.0) * 0.01;
  adStack_12a28[4] = (auVar23._8_8_ + -1.0) * 0.01;
  iVar9 = rand();
  auVar25._0_8_ = (double)iVar8 + (double)iVar8;
  auVar25._8_8_ = (double)iVar9 + (double)iVar9;
  auVar23 = divpd(auVar25,_DAT_00119010);
  dStack_12a58 = (auVar23._0_8_ + -1.0) * 0.01;
  dStack_12a50 = (auVar23._8_8_ + -1.0) * 0.01;
  adStack_12a28[2] = dStack_12a58;
  adStack_12a28[5] = dStack_12a50;
  iVar8 = rand();
  iVar9 = rand();
  auVar26._0_8_ = (double)iVar8 + (double)iVar8;
  auVar26._8_8_ = (double)iVar9 + (double)iVar9;
  auVar23 = divpd(auVar26,_DAT_00119010);
  adStack_129f8[0] = (auVar23._0_8_ + -1.0) * 0.01;
  adStack_129f8[1] = (auVar23._8_8_ + -1.0) * 0.01;
  iVar8 = rand();
  dVar19 = (((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0) * 0.01;
  lVar13 = 0;
  adStack_129f8[2] = dVar19;
  do {
    iVar8 = rand();
    adStack_12808[lVar13] = (((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0) * 0.01;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10);
  pdVar11 = &dStack_126d8;
  lVar13 = 0;
  do {
    dVar20 = adStack_12a28[lVar13];
    dVar5 = adStack_12a28[lVar13 + 3];
    dVar21 = adStack_12a28[lVar13 + 6];
    dVar27 = dVar21 * adStack_129f8[1] + dVar5 * adStack_12a28[4] + dVar20 * adStack_12a28[1];
    auVar6._8_4_ = SUB84(dVar27,0);
    auVar6._0_8_ = dVar21 * adStack_129f8[0] + dVar5 * adStack_12a28[3] + dVar20 * adStack_12a28[0];
    auVar6._12_4_ = (int)((ulong)dVar27 >> 0x20);
    *(undefined1 (*) [16])(pdVar11 + -2) = auVar6;
    *pdVar11 = dVar5 * dStack_12a50 + dVar21 * dVar19 + dVar20 * dStack_12a58;
    lVar13 = lVar13 + 1;
    pdVar11 = pdVar11 + 3;
  } while (lVar13 != 3);
  dStack_12958 = adStack_129f8[0];
  dStack_12950 = adStack_129f8[1];
  dStack_12948 = adStack_12a28[3];
  dStack_12940 = adStack_12a28[4];
  dStack_12938 = adStack_12a28[0];
  dStack_12930 = adStack_12a28[1];
  lVar13 = 0;
  do {
    dVar20 = *(double *)((long)adStack_12808 + lVar13);
    dVar5 = *(double *)((long)adStack_12808 + lVar13 + 0x20);
    dVar21 = *(double *)((long)adStack_12808 + lVar13 + 0x40);
    dVar27 = *(double *)((long)adStack_12808 + lVar13 + 0x60);
    *(double *)((long)adStack_12698 + lVar13 * 4) =
         adStack_12808[0xc] * dVar27 +
         adStack_12808[8] * dVar21 + adStack_12808[4] * dVar5 + adStack_12808[0] * dVar20;
    *(double *)((long)adStack_12698 + lVar13 * 4 + 8) =
         adStack_12808[0xd] * dVar27 +
         adStack_12808[9] * dVar21 + adStack_12808[5] * dVar5 + adStack_12808[1] * dVar20;
    *(double *)((long)adStack_12698 + lVar13 * 4 + 0x10) =
         dVar27 * adStack_12808[0xe] +
         dVar21 * adStack_12808[10] + dVar5 * adStack_12808[6] + dVar20 * adStack_12808[2];
    *(double *)((long)adStack_12698 + lVar13 * 4 + 0x18) =
         dVar27 * adStack_12808[0xf] +
         dVar21 * adStack_12808[0xb] + dVar5 * adStack_12808[7] + dVar20 * adStack_12808[3];
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x20);
  dStack_12928 = adStack_12808[0xe];
  dStack_12920 = adStack_12808[0xf];
  dStack_12918 = adStack_12808[10];
  dStack_12910 = adStack_12808[0xb];
  dStack_12908 = adStack_12808[0xc];
  dStack_12900 = adStack_12808[0xd];
  dStack_128f8 = adStack_12808[8];
  dStack_128f0 = adStack_12808[9];
  dStack_128e8 = adStack_12808[6];
  dStack_128e0 = adStack_12808[7];
  dStack_128d8 = adStack_12808[4];
  dStack_128d0 = adStack_12808[5];
  dStack_128c8 = adStack_12808[2];
  dStack_128c0 = adStack_12808[3];
  dStack_128b8 = adStack_12808[0];
  dStack_128b0 = adStack_12808[1];
  stack0xffffffffffff82b8 = (undefined1  [16])0x0;
  dStack_12ad8 = 0.0;
  local_7d58._0_16_ = (undefined1  [16])0x0;
  iVar8 = rand();
  adStack_12ab8[0] = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  lVar13 = 1;
  dStack_12aa8 = 0.0;
  dStack_12aa0 = 0.0;
  DStack_12268.m_data.array[0] =
       (plain_array<double,_1,_0,_0>)(plain_array<double,_1,_0,_0>)adStack_12ab8[0];
  do {
    lVar14 = 0;
    do {
      dVar20 = boost::random::detail::unit_normal_distribution<double>::operator()
                         ((unit_normal_distribution<double> *)&CStack_12868,&lStack_10318);
      AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[lVar14] = dVar20 + 0.0;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    dVar20 = dStack_12900 *
             AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[3] +
             dStack_128f0 *
             AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[2] +
             dStack_128d0 *
             AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[1] +
             dStack_128b0 *
             AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[0];
    auStack_12878._8_4_ = SUB84(dVar20,0);
    auStack_12878._0_8_ =
         dStack_12908 *
         AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[3] +
         dStack_128f8 *
         AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[2] +
         dStack_128d8 *
         AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[1] +
         dStack_128b8 *
         AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    auStack_12878._12_4_ = (int)((ulong)dVar20 >> 0x20);
    dVar21 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[0] * dStack_128c8;
    dVar27 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[0] * dStack_128c0;
    dVar20 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[1] * dStack_128e8;
    dVar5 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array[1] * dStack_128e0;
    dVar29 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[2] * dStack_12918;
    dVar31 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[2] * dStack_12910;
    dVar35 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[3] * dStack_12928;
    dVar36 = AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
             m_data.array[3] * dStack_12920;
    lVar14 = 0;
    do {
      dVar22 = boost::random::detail::unit_normal_distribution<double>::operator()
                         ((unit_normal_distribution<double> *)&SStack_12a88,&lStack_10318);
      CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
      array[lVar14] = dVar22 + 0.0;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    dStack_12898 = dStack_12958 *
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[2] +
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[1] * dStack_12948 +
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[0] * dStack_12938;
    dStack_12890 = dStack_12950 *
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[2] +
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[1] * dStack_12940 +
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[0] * dStack_12930;
    dStack_128a0 = CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[1] * dStack_12a50;
    dStack_128a8 = dStack_128a0 +
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[2] * dVar19 +
                   CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[0] * dStack_12a58;
    iVar8 = rand();
    dStack_12a60 = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
    aIStack_12260[lVar13 + -1].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
    m_storage.m_data.array[0] = dStack_12a60;
    lVar14 = lVar13 + -1;
    lVar12 = lVar14 * 0x80;
    dStack_12888 = adStack_12ab8[0] * adStack_12ab8[0];
    dVar22 = ((double *)((long)pvStack_129d0 + lVar12))[1] * dStack_12ad8;
    pdVar11 = (double *)((long)pvStack_129d0 + lVar12 + 0x20);
    pdVar1 = (double *)((long)pvStack_129d0 + lVar12 + 0x40);
    pdVar2 = (double *)((long)pvStack_129d0 + lVar12 + 0x60);
    pdVar3 = (double *)((long)pvStack_129d0 + lVar12 + 0x10);
    dVar33 = dStack_12ad8 * *pdVar3;
    dVar34 = dStack_12ad8 * pdVar3[1];
    pdVar3 = (double *)((long)pvStack_129d0 + lVar12 + 0x30);
    dVar30 = SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array[1] * *pdVar3;
    dVar32 = SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array[1] * pdVar3[1];
    pdVar3 = (double *)((long)pvStack_129d0 + lVar12 + 0x50);
    dVar28 = dStack_12aa8 * pdVar3[1];
    pdVar4 = (double *)((long)pvStack_129d0 + lVar12 + 0x70);
    dStack_12ad8 = dStack_12998 * dStack_12888 +
                   *pdVar2 * dStack_12aa0 +
                   *pdVar1 * dStack_12aa8 +
                   *pdVar11 *
                   SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1] +
                   *(double *)((long)pvStack_129d0 + lVar12) * dStack_12ad8 +
                   (double)auStack_12878._0_8_;
    SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [1] = dStack_12990 * dStack_12888 +
          pdVar2[1] * dStack_12aa0 +
          pdVar1[1] * dStack_12aa8 +
          pdVar11[1] *
          SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
          .array[1] + dVar22 + (double)auStack_12878._8_8_;
    dStack_12aa8 = dStack_12aa0 * *pdVar4 + dStack_12aa8 * *pdVar3 + dVar30 + dVar33 +
                   dStack_12888 * dStack_12988 + dVar35 + dVar29 + dVar20 + dVar21;
    dStack_12aa0 = dStack_12aa0 * pdVar4[1] + dVar28 + dVar32 + dVar34 + dStack_12888 * dStack_12980
                   + dVar36 + dVar31 + dVar5 + dVar27;
    *(double *)(local_7d58 + lVar13 * 0x20) = dStack_12ad8;
    *(double *)(local_7d58 + lVar13 * 0x20 + 8) =
         SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[1];
    adStack_7d40[lVar13 * 4 + -1] = dStack_12aa8;
    adStack_7d40[lVar13 * 4] = dStack_12aa0;
    SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [0] = dStack_12ad8;
    SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [2] = dStack_12aa8;
    SStack_12a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [3] = dStack_12aa0;
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              ((MeasureVector *)&SStack_12a88,&DStack_129d8,&SStack_12a48,
               aIStack_12260 + lVar13 + -1,(uint)lVar13);
    *(double *)((long)local_db18 + lVar14 * 0x18) =
         dStack_12898 +
         SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[0];
    *(double *)((long)local_db18 + lVar14 * 0x18 + 8) =
         dStack_12890 +
         SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[1];
    *(double *)((long)local_db18 + lVar14 * 0x18 + 0x10) =
         dStack_128a8 +
         SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[2];
    lVar13 = lVar13 + 1;
    adStack_12ab8[0] = dStack_12a60;
  } while (lVar13 != 0x3e9);
  iVar8 = rand();
  SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0] = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1] = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2] = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  iVar8 = rand();
  SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3] = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setState
            ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,&SStack_12a88,0);
  y_k = local_db18;
  if (EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.super_ZeroDelayObserver<4U,_3U,_1U>.x_.isSet_
      != false) {
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.k_ =
         EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.super_ZeroDelayObserver<4U,_3U,_1U>.x_.k_;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.isSet_ = true;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.k_ = 0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         dStack_126e8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         dStack_126e0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         dStack_126d8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         dStack_126d0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         dStack_126c8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         dStack_126c0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         dStack_126b8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         dStack_126b0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         dStack_126a8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.isSet_ = true;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.k_ = 0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         adStack_12698[0];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         adStack_12698[1];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         adStack_12698[2];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         adStack_12698[3];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         adStack_12698[4];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
         adStack_12698[5];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         adStack_12698[6];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
         adStack_12698[7];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
         adStack_12698[8];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
         adStack_12698[9];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
         adStack_12698[10];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
         adStack_12698[0xb];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
         adStack_12698[0xc];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] =
         adStack_12698[0xd];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] =
         adStack_12698[0xe];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
         adStack_12698[0xf];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.isSet_ = true;
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
              ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,(InputVector *)&DStack_12268,0);
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [0] = 1e-08;
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [1] = 1e-08;
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [2] = 1e-08;
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [3] = 1e-08;
    lVar13 = -1000;
    u_k = aIStack_12260;
    do {
      k_00 = (int)lVar13 + 0x3e9;
      stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setMeasurement
                ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,(MeasureVector *)y_k,k_00);
      stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
                ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,u_k,k_00);
      stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getAMatrixFD
                (&AStack_12788,&EStack_125f8,&SStack_12618);
      stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getCMatrixFD
                (&CStack_12868,&EStack_125f8,&SStack_12618);
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.k_ = 0;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[0];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[1];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[2];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[3];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[4];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[5];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[6];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[7];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[8];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[9];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[10];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[0xb];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[0xc];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[0xd];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[0xe];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
           AStack_12788.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
           m_data.array[0xf];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.isSet_ = true;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.k_ = 0;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[0];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[1];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[2];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[3];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[4];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[5];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[6];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[7];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[8];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[9];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[10] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[10];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0xb] =
           CStack_12868.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[0xb];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.isSet_ = true;
      stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::getEstimatedState
                (&SStack_12708,(ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,k_00);
      SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[0] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[0];
      SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[1] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[1];
      SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[2] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[2];
      SStack_12a88.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[3] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[3];
      u_k = u_k + 1;
      y_k = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)&y_k->m_dstExpr;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0);
    DStack_129d8._vptr_DynamicsFunctorBase =
         (_func_int **)&PTR_Matrix<double,1,1,0,1,1>_const__unsigned_int__00121650;
    if (pvStack_129b8 != (void *)0x0) {
      free(pvStack_129b8);
    }
    if (pvStack_129d0 != (void *)0x0) {
      free(pvStack_129d0);
    }
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.super_ZeroDelayObserver<4U,_3U,_1U>.
    super_ObserverBase<4U,_3U,_1U>._vptr_ObserverBase =
         (_func_int **)&PTR__ZeroDelayObserver_001216e0;
    std::
    _Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
    ::~_Deque_base(&EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.
                    super_ZeroDelayObserver<4U,_3U,_1U>.u_.
                    super__Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
                  );
    std::
    _Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
    ::~_Deque_base(&EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.
                    super_ZeroDelayObserver<4U,_3U,_1U>.y_.
                    super__Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                  );
    return SQRT((SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[3] - adStack_7d40[4000]) *
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[3] - adStack_7d40[4000]) +
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[1] - adStack_7d40[0xf9e]) *
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[1] - adStack_7d40[0xf9e]) +
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[2] - adStack_7d40[3999]) *
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[2] - adStack_7d40[3999]) +
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[0] - adStack_7d40[0xf9d]) *
                (SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[0] - adStack_7d40[0xf9d]));
  }
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,
                "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]"
               );
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::compileTime::ExtendedKalmanFilter<4,3,1> ekf;


    struct KalmanFunctorLTV:
                public ekf::DynamicsFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=ekf::StateVector::Random();
            n_=ekf::MeasureVector::Random();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( ekf::Amatrix::Random()*0.5 );
                c.push_back( ekf::Cmatrix::Random() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u*u.transpose())[0]*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u*u.transpose())[0]*n_;
            return yk;
        }

        std::vector<ekf::Amatrix,Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix,Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    ekf f;

    ekf::Amatrix a;
    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=ekf::StateVector::Zero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=ekf::Rmatrix::Random()*0.01;

    ekf::Qmatrix q1=ekf::Qmatrix::Random()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=ekf::InputVector::Random();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v;
        for (unsigned i=0;i<ekf::stateSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w;
        for (unsigned i=0;i<ekf::measureSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=ekf::InputVector::Random();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=ekf::StateVector::Random();

    f.setState(xh,0);

    ekf::Pmatrix p=ekf::Pmatrix::Zero();



    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<ekf::stateSize;++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=ekf::StateVector::Constant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error(xh-xk[kmax]);

    return error.norm();

}